

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::is_physical_pointer_to_buffer_block(Compiler *this,SPIRType *type)

{
  bool bVar1;
  bool bVar2;
  SPIRType *pSVar3;
  
  bVar2 = false;
  if ((*(int *)&(type->super_IVariant).field_0xc == 0x20) &&
     (bVar2 = false, type->storage == StorageClassPhysicalStorageBuffer)) {
    pSVar3 = get_pointee_type(this,type);
    if ((pSVar3->super_IVariant).self.id == (type->parent_type).id) {
      bVar1 = ParsedIR::has_decoration(&this->ir,(ID)(type->super_IVariant).self.id,DecorationBlock)
      ;
      bVar2 = true;
      if (!bVar1) {
        bVar2 = ParsedIR::has_decoration
                          (&this->ir,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
        return bVar2;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Compiler::is_physical_pointer_to_buffer_block(const SPIRType &type) const
{
	return is_physical_pointer(type) && get_pointee_type(type).self == type.parent_type &&
	       (has_decoration(type.self, DecorationBlock) ||
	        has_decoration(type.self, DecorationBufferBlock));
}